

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O3

int gethtmltagdata(char *str,char *tag,char **pTagParams,char **pTagData)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  char *__dest_00;
  long lVar6;
  char *start;
  char cVar7;
  uint uVar8;
  int count;
  char *ptr;
  uint local_60;
  int local_5c;
  char *local_58;
  char *local_50;
  char **local_48;
  char *local_40;
  char **local_38;
  
  local_50 = (char *)0x0;
  local_60 = 0;
  sVar4 = strlen(tag);
  __dest = (char *)calloc(sVar4 + 2,1);
  iVar3 = 6;
  if (__dest == (char *)0x0) {
    return 6;
  }
  *__dest = '<';
  strcat(__dest,tag);
  pcVar5 = stristrbeginend(str,__dest,">",&local_50,(int *)&local_60);
  if (pcVar5 == (char *)0x0) {
LAB_0016744b:
    free(__dest);
    iVar3 = 4;
  }
  else {
    sVar4 = (size_t)(int)local_60;
    local_38 = pTagData;
    local_58 = (char *)calloc(sVar4 + 1,1);
    *pTagParams = local_58;
    if (local_58 != (char *)0x0) {
      local_40 = local_50;
      local_48 = pTagParams;
      memcpy(local_58,local_50,sVar4);
      sVar4 = strlen(tag);
      pcVar5 = (char *)calloc(sVar4 + 4,1);
      if (pcVar5 != (char *)0x0) {
        pcVar5[0] = '<';
        pcVar5[1] = '/';
        strcat(pcVar5,tag);
        sVar4 = strlen(pcVar5);
        (pcVar5 + sVar4)[0] = '>';
        (pcVar5 + sVar4)[1] = '\0';
        cVar7 = *str;
        if (cVar7 != '\0') {
          cVar1 = *pcVar5;
          local_5c = toupper((int)cVar1);
          iVar3 = local_5c;
          do {
            while (iVar2 = toupper((int)cVar7), iVar2 == iVar3) {
              lVar6 = 1;
              cVar7 = cVar1;
              while( true ) {
                iVar3 = toupper((int)str[lVar6 + -1]);
                iVar2 = toupper((int)cVar7);
                if (iVar3 != iVar2) break;
                cVar7 = pcVar5[lVar6];
                lVar6 = lVar6 + 1;
                if (cVar7 == '\0') {
                  uVar8 = (int)str - (int)local_40;
                  local_60 = uVar8;
                  if (-1 < (int)uVar8) {
                    __dest_00 = (char *)calloc((ulong)(uVar8 + 1),1);
                    *local_38 = __dest_00;
                    if (__dest_00 != (char *)0x0) {
                      memcpy(__dest_00,str,(ulong)(uVar8 & 0x7fffffff));
                      free(pcVar5);
                      free(__dest);
                      return 0;
                    }
                    free(pcVar5);
                    free(*local_48);
                    free(__dest);
                    return 6;
                  }
                  goto LAB_00167439;
                }
              }
              cVar7 = str[1];
              str = str + 1;
              iVar3 = local_5c;
              if (cVar7 == '\0') goto LAB_00167439;
            }
            cVar7 = str[1];
            str = str + 1;
          } while (cVar7 != '\0');
        }
LAB_00167439:
        free(pcVar5);
        free(local_58);
        goto LAB_0016744b;
      }
      free(local_58);
    }
    free(__dest);
  }
  return iVar3;
}

Assistant:

inline int gethtmltagdata(char* str, char* tag, char** pTagParams, char** pTagData)
{
	char* ptr = NULL;
	char* ptr2 = NULL;
	int count = 0;
	char* tagbegin = NULL;
	char* tagend = NULL;

	tagbegin = (char*)calloc(strlen(tag)+2, 1);
	if (tagbegin == NULL)
	{
		return EXIT_OUT_OF_MEMORY;
	}

	tagbegin[0] = '<';
	strcat(tagbegin, tag);

	if (stristrbeginend(str, tagbegin, ">", &ptr, &count) == NULL)
	{
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	*pTagParams = (char*)calloc(count+1, 1);
	if (*pTagParams == NULL)
	{
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}
	
	memcpy(*pTagParams, ptr, count);

	tagend = (char*)calloc(strlen(tag)+4, 1);
	if (tagend == NULL)
	{
		free(*pTagParams);
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}

	tagend[0] = '<';
	tagend[1] = '/';
	strcat(tagend, tag);
	strcat(tagend, ">");

	ptr2 = stristr(str, tagend);
	if (ptr2 == NULL)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	count = (int)(ptr2-ptr);
	if (count < 0)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	*pTagData = (char*)calloc(count+1, 1);
	if (*pTagData == NULL)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}
	
	memcpy(*pTagData, ptr2, count);

	free(tagend);
	free(tagbegin);

	return EXIT_SUCCESS;
}